

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* INTERACTIONS::expand_interactions
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *vec,size_t required_length,string *err_msg)

{
  pointer pbVar1;
  vw_exception *pvVar2;
  pointer ns;
  string temp;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ns = (vec->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (vec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ns != pbVar1) {
    do {
      if (ns->_M_string_length != required_length && required_length != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(err_msg->_M_dataplus)._M_p,
                   err_msg->_M_string_length);
        pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/interactions.cc"
                   ,0x45,&local_1d8);
        __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (ns->_M_string_length < 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),
                   "error, feature interactions must involve at least two namespaces",0x40);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(err_msg->_M_dataplus)._M_p,
                   err_msg->_M_string_length);
        pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/interactions.cc"
                   ,0x49,&local_1f8);
        __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_1b8._8_8_ = 0;
      local_1b8[0x10] = '\0';
      local_1b8._0_8_ = local_1b8 + 0x10;
      expand_namespaces_with_recursion(ns,__return_storage_ptr__,(string *)local_1b8,0);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
      ns = ns + 1;
    } while (ns != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> expand_interactions(
    const vector<string>& vec, const size_t required_length, const string& err_msg)
{
  std::vector<std::string> res;

  for (string const& i : vec)
  {
    const size_t len = i.length();
    if (required_length > 0 && len != required_length)
    // got strict requirement of interaction length and it was failed.
    {
      THROW(err_msg);
    }
    else if (len < 2)
      // regardles of required_length value this check is always performed
      THROW("error, feature interactions must involve at least two namespaces" << err_msg);

    std::string temp;
    expand_namespaces_with_recursion(i, res, temp, 0);
  }
  return res;
}